

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CountBFS<ttt::Board>(int depth)

{
  initializer_list<ttt::Board> __l;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference plVar4;
  size_type sVar5;
  int in_EDI;
  undefined1 auVar6 [16];
  rep millis;
  time_point t2;
  Board ng;
  long m;
  iterator __end0_1;
  iterator __begin0_1;
  vector<long,_std::allocator<long>_> *__range3;
  vector<long,_std::allocator<long>_> moves;
  Board *g;
  iterator __end0;
  iterator __begin0;
  vector<ttt::Board,_std::allocator<ttt::Board>_> *__range2;
  time_point t1;
  int i;
  int current_level;
  vector<ttt::Board,_std::allocator<ttt::Board>_> levels [2];
  longlong total;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffde8;
  __normal_iterator<ttt::Board_*,_std::vector<ttt::Board,_std::allocator<ttt::Board>_>_>
  *in_stack_fffffffffffffdf0;
  Board *in_stack_fffffffffffffdf8;
  Board *in_stack_fffffffffffffe00;
  allocator_type *in_stack_fffffffffffffe18;
  vector<ttt::Board,_std::allocator<ttt::Board>_> *pvVar7;
  vector<ttt::Board,_std::allocator<ttt::Board>_> *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  size_type in_stack_fffffffffffffe30;
  duration<long,_std::ratio<1L,_1000L>_> local_110;
  rep local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined2 local_f0;
  long local_e8;
  long *local_e0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [24];
  reference local_b0;
  Board *local_a8;
  __normal_iterator<ttt::Board_*,_std::vector<ttt::Board,_std::allocator<ttt::Board>_>_> local_a0;
  vector<ttt::Board,_std::allocator<ttt::Board>_> *local_98;
  undefined8 local_90;
  int local_88;
  int local_84;
  undefined1 local_7e;
  undefined1 local_6a [10];
  undefined1 *local_60;
  undefined8 local_58;
  vector<ttt::Board,_std::allocator<ttt::Board>_> *local_50;
  vector<ttt::Board,_std::allocator<ttt::Board>_> local_48 [2];
  pointer local_10;
  int local_4;
  
  local_4 = in_EDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  std::operator<<(poVar3," bytes\n");
  local_10 = (pointer)0x1;
  local_7e = 1;
  local_50 = local_48;
  ttt::Board::Board(in_stack_fffffffffffffe00);
  local_60 = local_6a;
  local_58 = 1;
  std::allocator<ttt::Board>::allocator((allocator<ttt::Board> *)0x1ee0e1);
  __l._M_len = in_stack_fffffffffffffe30;
  __l._M_array = in_stack_fffffffffffffe28;
  std::vector<ttt::Board,_std::allocator<ttt::Board>_>::vector
            (in_stack_fffffffffffffe20,__l,in_stack_fffffffffffffe18);
  local_50 = local_48 + 1;
  do {
    pvVar7 = local_50;
    memset(local_50,0,0x18);
    std::vector<ttt::Board,_std::allocator<ttt::Board>_>::vector
              ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)0x1ee161);
    local_50 = pvVar7 + 1;
  } while (local_50 != (vector<ttt::Board,_std::allocator<ttt::Board>_> *)&stack0xffffffffffffffe8);
  local_7e = 0;
  std::allocator<ttt::Board>::~allocator((allocator<ttt::Board> *)0x1ee19f);
  local_84 = 0;
  for (local_88 = 0; local_88 < local_4; local_88 = local_88 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_88 + 1);
    std::operator<<(poVar3,'\n');
    std::vector<ttt::Board,_std::allocator<ttt::Board>_>::clear
              ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)0x1ee23c);
    local_90 = std::chrono::_V2::system_clock::now();
    local_98 = local_48 + local_84;
    local_a0._M_current =
         (Board *)std::vector<ttt::Board,_std::allocator<ttt::Board>_>::begin
                            ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)
                             in_stack_fffffffffffffde8);
    local_a8 = (Board *)std::vector<ttt::Board,_std::allocator<ttt::Board>_>::end
                                  ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)
                                   in_stack_fffffffffffffde8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffdf0,
                              (__normal_iterator<ttt::Board_*,_std::vector<ttt::Board,_std::allocator<ttt::Board>_>_>
                               *)in_stack_fffffffffffffde8), bVar1) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<ttt::Board_*,_std::vector<ttt::Board,_std::allocator<ttt::Board>_>_>
                 ::operator*(&local_a0);
      iVar2 = ttt::Board::GetStatus((Board *)0x1ee2d2);
      if (iVar2 == -1) {
        ttt::Board::GetPossibleMoves(in_stack_fffffffffffffe28);
        local_d0 = local_c8;
        local_d8._M_current =
             (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffde8);
        local_e0 = (long *)std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffde8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffdf0,
                                  (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)in_stack_fffffffffffffde8), bVar1) {
          plVar4 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator*(&local_d8);
          local_e8 = *plVar4;
          local_f0 = *(undefined2 *)((local_b0->board)._M_elems[2]._M_elems + 2);
          local_f8 = *(undefined8 *)(local_b0->board)._M_elems;
          ttt::Board::ApplyMove(in_stack_fffffffffffffe00,(IMove *)in_stack_fffffffffffffdf8);
          std::vector<ttt::Board,std::allocator<ttt::Board>>::emplace_back<ttt::Board&>
                    ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffdf8);
          __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
          operator++(&local_d8);
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe00);
      }
      __gnu_cxx::
      __normal_iterator<ttt::Board_*,_std::vector<ttt::Board,_std::allocator<ttt::Board>_>_>::
      operator++(&local_a0);
    }
    local_100 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffdf8,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffdf0);
    local_110.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffde8);
    local_108 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_110);
    sVar5 = std::vector<ttt::Board,_std::allocator<ttt::Board>_>::size(local_48 + (1 - local_84));
    local_10 = (pointer)((local_10->board)._M_elems[0]._M_elems + sVar5);
    poVar3 = std::operator<<((ostream *)&std::cout,"Current depth count: ");
    sVar5 = std::vector<ttt::Board,_std::allocator<ttt::Board>_>::size(local_48 + (1 - local_84));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
    poVar3 = std::operator<<(poVar3,", size: ");
    sVar5 = std::vector<ttt::Board,_std::allocator<ttt::Board>_>::size(local_48 + (1 - local_84));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5 * 10 >> 0x14);
    std::operator<<(poVar3,"MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Total count: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(longlong)local_10);
    poVar3 = std::operator<<(poVar3,", size: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)((long)local_10 * 10) >> 0x14);
    std::operator<<(poVar3," MB\n");
    poVar3 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_108 / 1000);
    poVar3 = std::operator<<(poVar3," seconds ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_108 % 1000);
    in_stack_fffffffffffffe28 = (iterator)std::operator<<(poVar3," milliseconds, ");
    sVar5 = std::vector<ttt::Board,_std::allocator<ttt::Board>_>::size(local_48 + (1 - local_84));
    auVar6._8_4_ = (int)(sVar5 >> 0x20);
    auVar6._0_8_ = sVar5;
    auVar6._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)in_stack_fffffffffffffe28,
                        (((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)) /
                        (double)local_108) * 1000.0);
    std::operator<<(poVar3," nps\n");
    local_84 = 1 - local_84;
  }
  pvVar7 = (vector<ttt::Board,_std::allocator<ttt::Board>_> *)&stack0xffffffffffffffe8;
  do {
    pvVar7 = pvVar7 + -1;
    std::vector<ttt::Board,_std::allocator<ttt::Board>_>::~vector
              ((vector<ttt::Board,_std::allocator<ttt::Board>_> *)in_stack_fffffffffffffe00);
  } while (pvVar7 != local_48);
  return;
}

Assistant:

void
static CountBFS(int depth)
{
    std::cout << "Game size: " << sizeof(IGame) << " bytes\n";
    long long total = 1;
    std::vector<IGame> levels[2] = {{{}}};
    int current_level = 0;
    for (int i = 0; i < depth; ++i)
    {
        std::cout << "Working on depth: " << i + 1 << '\n';
        levels[1 - current_level].clear();
        auto t1 = std::chrono::high_resolution_clock::now();
        for (const auto &g : levels[current_level])
        {
            if (g.GetStatus() != game::Undecided)
                continue;
            auto moves = g.GetPossibleMoves();
            for (auto m : moves)
            {
                auto ng = g;
                ng.ApplyMove(m);
                levels[1 - current_level].emplace_back(ng);
            }
        }
        auto t2 = std::chrono::high_resolution_clock::now();
        auto millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        total += levels[1 - current_level].size();
        std::cout << "Current depth count: " << levels[1 - current_level].size() << ", size: " << levels[1 - current_level].size() * sizeof(IGame) / (1 << 20) << "MB\n";
        std::cout << "Total count: " << total << ", size: " << total * sizeof(IGame) / (1 << 20) << " MB\n";
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds, " << double(levels[1 - current_level].size()) / millis * 1000 << " nps\n";
        current_level = 1 - current_level;
    }
}